

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O3

void __thiscall
lzham::lzham_decompressor::lzham_decompressor
          (lzham_decompressor *this,lzham_malloc_context malloc_context)

{
  adaptive_bit_model *paVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  this->m_malloc_context = malloc_context;
  symbol_codec::symbol_codec(&this->m_codec,malloc_context);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
            (&this->m_lit_table,malloc_context,false,0,0,0);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
            (&this->m_delta_lit_table,malloc_context,false,0,0,0);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
            (&this->m_main_table,malloc_context,false,0,0,0);
  lVar4 = 0;
  do {
    quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
              ((quasi_adaptive_huffman_data_model *)(&this->field_0x318 + lVar4),
               (lzham_malloc_context)0x0,false,0,0,0);
    lVar4 = lVar4 + 0x90;
  } while (lVar4 != 0x120);
  lVar4 = 0;
  do {
    quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
              ((quasi_adaptive_huffman_data_model *)(&this->field_0x438 + lVar4),
               (lzham_malloc_context)0x0,false,0,0,0);
    lVar4 = lVar4 + 0x90;
  } while (lVar4 != 0x120);
  quasi_adaptive_huffman_data_model::quasi_adaptive_huffman_data_model
            (&this->m_dist_lsb_table,malloc_context,false,0,0,0);
  uVar3 = 0;
  do {
    if (uVar3 < 0xc) {
      paVar1 = this->m_is_match_model + uVar3;
      paVar1->m_bit_0_prob = 0x400;
      paVar1[1] = 0x400;
      paVar1[2] = 0x400;
      paVar1[3] = 0x400;
    }
    uVar3 = uVar3 + 4;
  } while (uVar3 != 0xc);
  uVar3 = 0;
  do {
    if (uVar3 < 0xc) {
      paVar1 = this->m_is_rep_model + uVar3;
      paVar1->m_bit_0_prob = 0x400;
      paVar1[1] = 0x400;
      paVar1[2] = 0x400;
      paVar1[3] = 0x400;
    }
    uVar3 = uVar3 + 4;
  } while (uVar3 != 0xc);
  uVar3 = 0;
  do {
    if (uVar3 < 0xc) {
      paVar1 = this->m_is_rep0_model + uVar3;
      paVar1->m_bit_0_prob = 0x400;
      paVar1[1] = 0x400;
      paVar1[2] = 0x400;
      paVar1[3] = 0x400;
    }
    uVar3 = uVar3 + 4;
  } while (uVar3 != 0xc);
  uVar3 = 0;
  do {
    if (uVar3 < 0xc) {
      paVar1 = this->m_is_rep0_single_byte_model + uVar3;
      paVar1->m_bit_0_prob = 0x400;
      paVar1[1] = 0x400;
      paVar1[2] = 0x400;
      paVar1[3] = 0x400;
    }
    uVar3 = uVar3 + 4;
  } while (uVar3 != 0xc);
  uVar3 = 0;
  do {
    if (uVar3 < 0xc) {
      paVar1 = this->m_is_rep1_model + uVar3;
      paVar1->m_bit_0_prob = 0x400;
      paVar1[1] = 0x400;
      paVar1[2] = 0x400;
      paVar1[3] = 0x400;
    }
    uVar3 = uVar3 + 4;
  } while (uVar3 != 0xc);
  uVar3 = 0;
  do {
    if (uVar3 < 0xc) {
      paVar1 = this->m_is_rep2_model + uVar3;
      paVar1->m_bit_0_prob = 0x400;
      paVar1[1] = 0x400;
      paVar1[2] = 0x400;
      paVar1[3] = 0x400;
    }
    uVar3 = uVar3 + 4;
  } while (uVar3 != 0xc);
  lVar4 = 0;
  bVar2 = true;
  do {
    bVar5 = bVar2;
    quasi_adaptive_huffman_data_model::set_malloc_context
              ((quasi_adaptive_huffman_data_model *)(&this->field_0x318 + lVar4 * 0x90),
               malloc_context);
    quasi_adaptive_huffman_data_model::set_malloc_context
              ((quasi_adaptive_huffman_data_model *)(&this->field_0x438 + lVar4 * 0x90),
               malloc_context);
    lVar4 = 1;
    bVar2 = false;
  } while (bVar5);
  return;
}

Assistant:

lzham_decompressor(lzham_malloc_context malloc_context) : 
         m_malloc_context(malloc_context),
         m_codec(malloc_context),
         m_lit_table(malloc_context),
         m_delta_lit_table(malloc_context),
         m_main_table(malloc_context),
         m_dist_lsb_table(malloc_context)
      {
         for (uint i = 0; i < 2; i++)
         {
            m_rep_len_table[i].set_malloc_context(malloc_context);
            m_large_len_table[i].set_malloc_context(malloc_context);
         }
      }